

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialHexaANCF.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMaterialHexaANCF::ChMaterialHexaANCF
          (ChMaterialHexaANCF *this,double rho,double E,double nu)

{
  ChVector<double> local_48;
  ChVector<double> local_30;
  ChVector<double> local_18;
  
  this->m_rho = rho;
  local_48.m_data[0] = (E * 0.5) / (nu + 1.0);
  local_48.m_data[1] = local_48.m_data[0];
  local_48.m_data[2] = local_48.m_data[0];
  local_30.m_data[0] = nu;
  local_30.m_data[1] = nu;
  local_30.m_data[2] = nu;
  local_18.m_data[0] = E;
  local_18.m_data[1] = E;
  local_18.m_data[2] = E;
  Calc_D(this,&local_18,&local_30,&local_48);
  return;
}

Assistant:

ChMaterialHexaANCF::ChMaterialHexaANCF(double rho,  // material density
                                       double E,    // Young's modulus
                                       double nu    // Poisson ratio
                                       )
    : m_rho(rho) {
    double G = 0.5 * E / (1 + nu);
    Calc_D(ChVector<>(E), ChVector<>(nu), ChVector<>(G));
}